

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall DataSourceAmiga::get_hud_sprite(DataSourceAmiga *this,size_t index)

{
  size_t height;
  __shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *offset;
  reference pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar2;
  uint in_stack_ffffffffffffff5c;
  shared_ptr<Buffer> local_40;
  PBuffer data;
  size_t index_local;
  DataSourceAmiga *this_local;
  
  data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX;
  this_00 = (__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::array<std::shared_ptr<Buffer>,_24UL>::operator[]
                      ((array<std::shared_ptr<Buffer>,_24UL> *)(index + 0x88),0x12);
  offset = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            (&hud_offsets,
             (long)data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <<
             2);
  Buffer::get_tail((Buffer *)&stack0xffffffffffffffd0,(size_t)offset);
  std::shared_ptr<Buffer>::shared_ptr(&local_40,(shared_ptr<Buffer> *)&stack0xffffffffffffffd0);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&hud_offsets,
                      (long)data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi * 4 + 2);
  height = *pvVar1;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&hud_offsets,
                      (long)data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi * 4 + 3);
  decode_interlased_sprite
            (this,(PBuffer *)index,(size_t)&local_40,height,(uint8_t)*pvVar1,'\x10',
             (uint8_t *)((ulong)in_stack_ffffffffffffff5c << 0x20),0x1a80a0);
  std::shared_ptr<Buffer>::~shared_ptr(&local_40);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&stack0xffffffffffffffd0);
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::get_hud_sprite(size_t index) {
  PBuffer data = data_pointers[18]->get_tail(hud_offsets[index*4]);

  return decode_interlased_sprite(data, hud_offsets[index * 4 + 2],
                                  hud_offsets[index * 4 + 3], 16, 0, palette2);
}